

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O2

bool __thiscall
FIX::double_conversion::FastDtoa
          (double_conversion *this,double v,FastDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  double_conversion *pdVar5;
  char *pcVar6;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  undefined4 in_register_00000014;
  double_conversion *pdVar10;
  uint64_t uVar11;
  uint uVar12;
  int iVar13;
  int *piVar14;
  uint64_t rest;
  int index;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  DiyFp DVar19;
  DiyFp DVar20;
  int *kappa;
  DiyFp local_f8;
  DiyFp boundary_plus;
  uint64_t local_d8;
  uint local_cc;
  Vector<char> local_c8;
  ulong local_b8;
  DiyFp boundary_minus;
  DiyFp too_high;
  DiyFp local_78;
  DiyFp too_low;
  uint local_58;
  uint local_54;
  Vector<char> buffer_local;
  DiyFp ten_mk;
  
  pdVar10 = (double_conversion *)CONCAT44(in_register_00000014,requested_digits);
  piVar14 = buffer._8_8_;
  uVar2 = (uint)buffer.start_;
  buffer_local.start_ = (char *)pdVar10;
  buffer_local.length_ = uVar2;
  if (v <= 0.0) {
    __assert_fail("v > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x281,
                  "bool FIX::double_conversion::FastDtoa(double, FastDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  if (v == INFINITY) {
    __assert_fail("!Double(v).IsSpecial()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x282,
                  "bool FIX::double_conversion::FastDtoa(double, FastDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  uVar9 = (uint)this;
  local_f8.f_ = (uint64_t)v;
  if (uVar9 < 2) {
    DVar19 = Double::AsNormalizedDiyFp((Double *)&local_f8);
    local_78.f_ = DVar19.f_;
    iVar13 = DVar19.e_;
    boundary_minus.f_ = 0;
    boundary_minus.e_ = 0;
    boundary_plus.f_ = 0;
    boundary_plus.e_ = 0;
    local_78.e_ = iVar13;
    if (uVar9 == 0) {
      local_f8.f_ = (uint64_t)v;
      Double::NormalizedBoundaries((Double *)&local_f8,&boundary_minus,&boundary_plus);
    }
    else {
      local_f8.f_ = CONCAT44(local_f8.f_._4_4_,(float)v);
      Single::NormalizedBoundaries((Single *)&local_f8,&boundary_minus,&boundary_plus);
    }
    if (boundary_plus.e_ != iVar13) {
      __assert_fail("boundary_plus.e() == w.e()",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x219,
                    "bool FIX::double_conversion::Grisu3(double, FastDtoaMode, Vector<char>, int *, int *)"
                   );
    }
    ten_mk.f_ = 0;
    ten_mk.e_ = 0;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar13,-0x60 - iVar13,&ten_mk,(int *)&local_cc);
    if (0x1c < ten_mk.e_ + iVar13 + 0x7cU) {
      __assert_fail("(kMinimalTargetExponent <= w.e() + ten_mk.e() + DiyFp::kSignificandSize) && (kMaximalTargetExponent >= w.e() + ten_mk.e() + DiyFp::kSignificandSize)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x227,
                    "bool FIX::double_conversion::Grisu3(double, FastDtoaMode, Vector<char>, int *, int *)"
                   );
    }
    local_c8.length_ = uVar2;
    DVar19 = DiyFp::Times(&local_78,&ten_mk);
    pdVar5 = (double_conversion *)DVar19.f_;
    uVar2 = DVar19.e_;
    if (uVar2 != boundary_plus.e_ + ten_mk.e_ + 0x40U) {
      __assert_fail("scaled_w.e() == boundary_plus.e() + ten_mk.e() + DiyFp::kSignificandSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x233,
                    "bool FIX::double_conversion::Grisu3(double, FastDtoaMode, Vector<char>, int *, int *)"
                   );
    }
    DVar19 = DiyFp::Times(&boundary_minus,&ten_mk);
    DVar20 = DiyFp::Times(&boundary_plus,&ten_mk);
    local_f8.f_ = (uint64_t)pdVar5;
    local_f8.e_ = uVar2;
    local_c8.start_ = (char *)pdVar10;
    if ((DVar19.e_ != uVar2) || (uVar2 != DVar20.e_)) {
      __assert_fail("low.e() == w.e() && w.e() == high.e()",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x132,
                    "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                   );
    }
    if (DVar20.f_ - 1 < DVar19.f_ + 1) {
      __assert_fail("low.f() + 1 <= high.f() - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x133,
                    "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                   );
    }
    if (0x1c < uVar2 + 0x3c) {
      __assert_fail("kMinimalTargetExponent <= w.e() && w.e() <= kMaximalTargetExponent",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x134,
                    "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                   );
    }
    too_low.f_ = DVar19.f_ - 1;
    too_high.f_ = DVar20.f_ + 1;
    too_high.e_ = uVar2;
    too_low.e_ = uVar2;
    DVar19 = DiyFp::Minus(&too_high,&too_low);
    uVar18 = DVar19.f_;
    local_d8 = 1;
    bVar8 = (byte)-uVar2;
    uVar11 = 1L << (bVar8 & 0x3f);
    uVar17 = too_high.f_ >> (bVar8 & 0x3f);
    local_b8 = uVar11 - 1;
    uVar16 = too_high.f_ & local_b8;
    BiggestPowerTen((uint32_t)uVar17,uVar2 + 0x40,&local_54,(int *)&local_58);
    *piVar14 = 0;
    uVar12 = (int)local_58 >> 0x1f & local_58;
    iVar13 = 0;
    uVar4 = local_54;
    for (uVar9 = local_58; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      uVar15 = (uVar17 & 0xffffffff) / (ulong)uVar4;
      uVar17 = (uVar17 & 0xffffffff) % (ulong)uVar4;
      if (9 < (int)uVar15) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x15e,
                      "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                     );
      }
      pcVar6 = Vector<char>::operator[](&local_c8,iVar13);
      iVar3 = local_c8.length_;
      pcVar7 = local_c8.start_;
      *pcVar6 = (char)uVar15 + '0';
      iVar13 = *piVar14 + 1;
      *piVar14 = iVar13;
      uVar15 = (uVar17 << (bVar8 & 0x3f)) + uVar16;
      if (uVar15 < uVar18) {
        DVar19 = DiyFp::Minus(&too_high,&local_f8);
        buffer_01.start_ = (ulong)(uint)iVar3;
        buffer_01.length_ = iVar13;
        buffer_01._12_4_ = 0;
        bVar1 = RoundWeed((double_conversion *)pcVar7,buffer_01,(int)DVar19.f_,uVar18,uVar15,
                          (ulong)uVar4 << (bVar8 & 0x3f),1,uVar18);
        if (!bVar1) {
          return false;
        }
        iVar13 = ~local_cc + uVar9;
        goto LAB_001809e2;
      }
      uVar4 = uVar4 / 10;
    }
    if ((int)uVar2 < -0x3c) {
      __assert_fail("one.e() >= -60",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x179,
                    "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                   );
    }
    if (0x3c < -uVar2) {
      __assert_fail("(((static_cast<uint64_t>(0xFFFFFFFF) << 32) + 0xFFFFFFFFu)) / 10 >= one.f()",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x17b,
                    "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                   );
    }
    do {
      uVar17 = uVar16 * 10 >> (bVar8 & 0x3f);
      if (9 < (int)uVar17) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x182,
                      "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                     );
      }
      uVar18 = uVar18 * 10;
      local_d8 = local_d8 * 10;
      pcVar6 = Vector<char>::operator[](&local_c8,iVar13);
      iVar3 = local_c8.length_;
      pcVar7 = local_c8.start_;
      *pcVar6 = (char)uVar17 + '0';
      iVar13 = *piVar14 + 1;
      *piVar14 = iVar13;
      uVar16 = uVar16 * 10 & local_b8;
      uVar12 = uVar12 - 1;
    } while (uVar18 <= uVar16);
    DVar19 = DiyFp::Minus(&too_high,&local_f8);
    buffer_00.start_ = (ulong)(uint)iVar3;
    buffer_00.length_ = iVar13;
    buffer_00._12_4_ = 0;
    bVar1 = RoundWeed((double_conversion *)pcVar7,buffer_00,(int)DVar19.f_ * (int)local_d8,uVar18,
                      uVar16,uVar11,local_d8,uVar18);
    if (!bVar1) {
      return false;
    }
    iVar13 = uVar12 - local_cc;
  }
  else {
    if (uVar9 != 2) {
      abort();
    }
    DVar19 = Double::AsNormalizedDiyFp((Double *)&local_f8);
    too_low.f_ = DVar19.f_;
    iVar13 = DVar19.e_;
    too_high.f_ = 0;
    too_high.e_ = 0;
    too_low.e_ = iVar13;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar13,-0x60 - iVar13,&too_high,(int *)&boundary_minus);
    if (0x1c < too_high.e_ + iVar13 + 0x7cU) {
      __assert_fail("(kMinimalTargetExponent <= w.e() + ten_mk.e() + DiyFp::kSignificandSize) && (kMaximalTargetExponent >= w.e() + ten_mk.e() + DiyFp::kSignificandSize)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x262,
                    "bool FIX::double_conversion::Grisu3Counted(double, int, Vector<char>, int *, int *)"
                   );
    }
    DVar19 = DiyFp::Times(&too_low,&too_high);
    iVar13 = DVar19.e_;
    local_f8.f_ = (uint64_t)pdVar10;
    local_f8.e_ = uVar2;
    if (0x1c < iVar13 + 0x3cU) {
      __assert_fail("kMinimalTargetExponent <= w.e() && w.e() <= kMaximalTargetExponent",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x1b1,
                    "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                   );
    }
    bVar8 = (byte)-iVar13;
    local_b8 = 1L << (bVar8 & 0x3f);
    uVar17 = local_b8 - 1;
    uVar16 = uVar17 & DVar19.f_;
    uVar18 = DVar19.f_ >> (bVar8 & 0x3f);
    kappa = (int *)0x18055d;
    BiggestPowerTen((uint32_t)uVar18,iVar13 + 0x40,(uint32_t *)&local_c8,(int *)&local_78);
    *piVar14 = 0;
    uVar2 = (int)(uint)local_78.f_ >> 0x1f & (uint)local_78.f_;
    iVar3 = (uint)local_78.f_ - mode;
    index = 0;
    uVar4 = (uint)local_c8.start_;
    for (uVar9 = (uint)local_78.f_; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      uVar15 = (uVar18 & 0xffffffff) / (ulong)uVar4;
      uVar18 = (uVar18 & 0xffffffff) % (ulong)uVar4;
      if (9 < (int)uVar15) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x1cd,
                      "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                     );
      }
      kappa = (int *)0x1805b2;
      pcVar7 = Vector<char>::operator[]((Vector<char> *)&local_f8,index);
      *pcVar7 = (char)uVar15 + '0';
      index = *piVar14 + 1;
      *piVar14 = index;
      if (mode == FAST_DTOA_SHORTEST_SINGLE) {
        boundary_plus.f_ = CONCAT44(boundary_plus.f_._4_4_,iVar3);
        goto LAB_0018099b;
      }
      kappa = (int *)0xa;
      uVar4 = uVar4 / 10;
      mode = mode - FAST_DTOA_SHORTEST_SINGLE;
    }
    boundary_plus.f_ = CONCAT44(boundary_plus.f_._4_4_,uVar2);
    if (mode == FAST_DTOA_SHORTEST) {
LAB_0018099b:
      iVar13 = (int)((uVar18 & 0xffffffff) << (bVar8 & 0x3f)) + (int)uVar16;
      uVar11 = 1;
      rest = (ulong)uVar4 << (bVar8 & 0x3f);
    }
    else {
      if (0x3c < (uint)-iVar13) {
        __assert_fail("(((static_cast<uint64_t>(0xFFFFFFFF) << 32) + 0xFFFFFFFFu)) / 10 >= one.f()",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x1e9,
                      "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                     );
      }
      kappa = (int *)0x1;
      for (uVar11 = 1; (0 < (int)mode && (uVar11 < uVar16)); uVar11 = uVar11 * 10) {
        uVar18 = uVar16 * 10 >> (bVar8 & 0x3f);
        if (9 < (int)uVar18) {
          __assert_fail("digit <= 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                        ,0x1ef,
                        "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                       );
        }
        kappa = (int *)0x180976;
        pcVar7 = Vector<char>::operator[]((Vector<char> *)&local_f8,index);
        *pcVar7 = (char)uVar18 + '0';
        index = *piVar14 + 1;
        *piVar14 = index;
        mode = mode - FAST_DTOA_SHORTEST_SINGLE;
        uVar16 = uVar16 * 10 & uVar17;
        uVar2 = uVar2 - 1;
      }
      boundary_plus.f_ = CONCAT44(boundary_plus.f_._4_4_,uVar2);
      if (mode != FAST_DTOA_SHORTEST) {
        return false;
      }
      iVar13 = (int)uVar16;
      rest = local_b8;
    }
    buffer_02.start_ = (ulong)(uint)local_f8.e_;
    buffer_02.length_ = index;
    buffer_02._12_4_ = 0;
    bVar1 = RoundWeedCounted((double_conversion *)local_f8.f_,buffer_02,iVar13,rest,uVar11,
                             (uint64_t)&boundary_plus,kappa);
    if (!bVar1) {
      return false;
    }
    iVar13 = (int)boundary_plus.f_ - (int)boundary_minus.f_;
  }
LAB_001809e2:
  *length = iVar13 + *piVar14;
  pcVar7 = Vector<char>::operator[](&buffer_local,*piVar14);
  *pcVar7 = '\0';
  return true;
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}